

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

Arena * absl::base_internal::LowLevelAlloc::NewArena(int32_t flags)

{
  Arena *this;
  undefined1 *arena;
  
  if ((anonymous_namespace)::create_globals_once != 0xdd) {
    NewArena();
  }
  if ((flags & 2U) == 0) {
    if ((flags & 1U) != 0) {
      arena = (anonymous_namespace)::default_arena_storage;
      goto LAB_00149c56;
    }
    arena = (anonymous_namespace)::unhooked_arena_storage;
  }
  else {
    arena = (anonymous_namespace)::unhooked_async_sig_safe_arena_storage;
  }
  if ((anonymous_namespace)::create_globals_once != 0xdd) {
    CallOnceImpl<void(&)()>
              ((atomic<unsigned_int> *)&(anonymous_namespace)::create_globals_once,
               SCHEDULE_KERNEL_ONLY,anon_unknown_0::CreateGlobalArenas);
  }
LAB_00149c56:
  this = (Arena *)AllocWithArena(0x148,(Arena *)arena);
  Arena::Arena(this,flags);
  return this;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArena(int32_t flags) {
  Arena *meta_data_arena = DefaultArena();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
  if ((flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
    meta_data_arena = UnhookedAsyncSigSafeArena();
  } else  // NOLINT(readability/braces)
#endif
      if ((flags & LowLevelAlloc::kCallMallocHook) == 0) {
    meta_data_arena = UnhookedArena();
  }
  Arena *result =
    new (AllocWithArena(sizeof (*result), meta_data_arena)) Arena(flags);
  return result;
}